

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::~Clipper(Clipper *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  this->_vptr_Clipper = pp_Var1;
  *(void **)((long)&this->_vptr_Clipper + (long)pp_Var1[-3]) = vtt[1];
  (*this->_vptr_Clipper[2])();
  DisposeScanbeamList(this);
  std::_Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>::
  ~_Vector_base(&(this->m_HorizJoins).
                 super__Vector_base<ClipperLib::HorzJoinRec_*,_std::allocator<ClipperLib::HorzJoinRec_*>_>
               );
  std::_Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::~_Vector_base
            (&(this->m_Joins).
              super__Vector_base<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>);
  std::_Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::~_Vector_base
            (&(this->m_PolyOuts).
              super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>);
  return;
}

Assistant:

Clipper::~Clipper() //destructor
{
  Clear();
  DisposeScanbeamList();
}